

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O2

string * __thiscall
duckdb::FixedDecimalStatistics::GetStats_abi_cxx11_
          (string *__return_storage_ptr__,FixedDecimalStatistics *this,hugeint_t *input)

{
  data_ptr_t in_RCX;
  hugeint_t input_00;
  data_t buffer [16];
  undefined1 auStack_28 [16];
  undefined1 local_18 [8];
  
  input_00.upper = (int64_t)auStack_28;
  input_00.lower = input->upper;
  WriteParquetDecimal((duckdb *)input->lower,input_00,in_RCX);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,auStack_28,local_18);
  return __return_storage_ptr__;
}

Assistant:

string GetStats(hugeint_t &input) {
		data_t buffer[16];
		WriteParquetDecimal(input, buffer);
		return string(const_char_ptr_cast(buffer), 16);
	}